

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

TokenOrSyntax * __thiscall
slang::syntax::ExternUdpDeclSyntax::getChild(ExternUdpDeclSyntax *this,size_t index)

{
  Token token;
  Token token_00;
  Token token_01;
  undefined8 in_RDX;
  long in_RSI;
  TokenOrSyntax *in_RDI;
  SyntaxNode *in_stack_ffffffffffffff78;
  TokenOrSyntax *in_stack_ffffffffffffff80;
  nullptr_t in_stack_ffffffffffffff88;
  Info *in_stack_ffffffffffffff90;
  
  switch(in_RDX) {
  case 0:
    TokenOrSyntax::TokenOrSyntax(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    break;
  case 1:
    token.info = in_stack_ffffffffffffff90;
    token._0_8_ = in_stack_ffffffffffffff88;
    TokenOrSyntax::TokenOrSyntax(in_stack_ffffffffffffff80,token);
    break;
  case 2:
    TokenOrSyntax::TokenOrSyntax((TokenOrSyntax *)(in_RSI + 0x60),in_stack_ffffffffffffff78);
    break;
  case 3:
    token_00.info = in_stack_ffffffffffffff90;
    token_00._0_8_ = in_stack_ffffffffffffff88;
    TokenOrSyntax::TokenOrSyntax(in_stack_ffffffffffffff80,token_00);
    break;
  case 4:
    token_01.info = in_stack_ffffffffffffff90;
    token_01._0_8_ = in_stack_ffffffffffffff88;
    TokenOrSyntax::TokenOrSyntax(in_stack_ffffffffffffff80,token_01);
    break;
  case 5:
    not_null<slang::syntax::UdpPortListSyntax_*>::get
              ((not_null<slang::syntax::UdpPortListSyntax_*> *)(in_RSI + 0xb8));
    TokenOrSyntax::TokenOrSyntax(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    break;
  default:
    TokenOrSyntax::TokenOrSyntax
              ((TokenOrSyntax *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  }
  return in_RDI;
}

Assistant:

TokenOrSyntax ExternUdpDeclSyntax::getChild(size_t index) {
    switch (index) {
        case 0: return &attributes;
        case 1: return externKeyword;
        case 2: return &actualAttributes;
        case 3: return primitive;
        case 4: return name;
        case 5: return portList.get();
        default: return nullptr;
    }
}